

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O2

bool leveldb::test::RegisterTest(char *base,char *name,_func_void *func)

{
  undefined8 *puVar1;
  undefined8 *__src;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  void *__dest;
  long lVar5;
  size_t __n;
  ulong uVar6;
  
  if ((anonymous_namespace)::tests == (undefined8 *)0x0) {
    (anonymous_namespace)::tests = (undefined8 *)operator_new(0x18);
    *(anonymous_namespace)::tests = 0;
    (anonymous_namespace)::tests[1] = 0;
    (anonymous_namespace)::tests[2] = 0;
  }
  puVar2 = (anonymous_namespace)::tests;
  puVar1 = (undefined8 *)(anonymous_namespace)::tests[1];
  if (puVar1 == (undefined8 *)(anonymous_namespace)::tests[2]) {
    __src = (undefined8 *)*(anonymous_namespace)::tests;
    __n = (long)puVar1 - (long)__src;
    if (__n == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar3 = (long)__n / 0x18;
    uVar4 = 1;
    if (puVar1 != __src) {
      uVar4 = uVar3;
    }
    uVar6 = uVar4 + uVar3;
    if (0x555555555555554 < uVar6) {
      uVar6 = 0x555555555555555;
    }
    if (CARRY8(uVar4,uVar3)) {
      uVar6 = 0x555555555555555;
    }
    if (uVar6 == 0) {
      __dest = (void *)0x0;
    }
    else {
      __dest = operator_new(uVar6 * 0x18);
    }
    lVar5 = uVar3 * 0x18;
    *(char **)((long)__dest + lVar5) = base;
    *(char **)((long)__dest + lVar5 + 8) = name;
    *(_func_void **)((long)__dest + lVar5 + 0x10) = func;
    if (0 < (long)__n) {
      memmove(__dest,__src,__n);
    }
    if (__src != (undefined8 *)0x0) {
      operator_delete(__src);
    }
    *puVar2 = __dest;
    puVar2[1] = (long)__dest + __n + 0x18;
    puVar2[2] = (void *)(uVar6 * 0x18 + (long)__dest);
  }
  else {
    *puVar1 = base;
    puVar1[1] = name;
    puVar1[2] = func;
    puVar2[1] = puVar2[1] + 0x18;
  }
  return true;
}

Assistant:

bool RegisterTest(const char* base, const char* name, void (*func)()) {
  if (tests == nullptr) {
    tests = new std::vector<Test>;
  }
  Test t;
  t.base = base;
  t.name = name;
  t.func = func;
  tests->push_back(t);
  return true;
}